

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::ImageTests::addCreateTexture2DActions(ImageTests *this,string *prefix)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *prefix_local;
  ImageTests *this_local;
  
  local_18 = prefix;
  prefix_local = (string *)this;
  std::operator+(&local_38,prefix,"rgb8");
  addCreateTexture(this,&local_38,0x30b1,0x1907,0x1907,0x1401);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_68,local_18,"rgb565");
  addCreateTexture(this,&local_68,0x30b1,0x1907,0x1907,0x8363);
  std::__cxx11::string::~string((string *)&local_68);
  std::operator+(&local_88,local_18,"rgba8");
  addCreateTexture(this,&local_88,0x30b1,0x1908,0x1908,0x1401);
  std::__cxx11::string::~string((string *)&local_88);
  std::operator+(&local_a8,local_18,"rgb5_a1");
  addCreateTexture(this,&local_a8,0x30b1,0x1908,0x1908,0x8034);
  std::__cxx11::string::~string((string *)&local_a8);
  std::operator+(&local_c8,local_18,"rgba4");
  addCreateTexture(this,&local_c8,0x30b1,0x1908,0x1908,0x8033);
  std::__cxx11::string::~string((string *)&local_c8);
  return;
}

Assistant:

void ImageTests::addCreateTexture2DActions (const string& prefix)
{
	addCreateTexture(prefix + "rgb8",		EGL_GL_TEXTURE_2D_KHR,	GL_RGB,		GL_RGB,		GL_UNSIGNED_BYTE);
	addCreateTexture(prefix + "rgb565",		EGL_GL_TEXTURE_2D_KHR,	GL_RGB,		GL_RGB,		GL_UNSIGNED_SHORT_5_6_5);
	addCreateTexture(prefix + "rgba8",		EGL_GL_TEXTURE_2D_KHR,	GL_RGBA,	GL_RGBA,	GL_UNSIGNED_BYTE);
	addCreateTexture(prefix + "rgb5_a1",	EGL_GL_TEXTURE_2D_KHR,	GL_RGBA,	GL_RGBA,	GL_UNSIGNED_SHORT_5_5_5_1);
	addCreateTexture(prefix + "rgba4",		EGL_GL_TEXTURE_2D_KHR,	GL_RGBA,	GL_RGBA,	GL_UNSIGNED_SHORT_4_4_4_4);
}